

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O0

int AF_A_DropWeaponPieces(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  PClass *pPVar1;
  uint uVar2;
  bool bVar3;
  int local_e4;
  AActor *local_d0;
  AActor *local_c8;
  bool local_bc;
  bool local_b9;
  bool local_b6;
  bool local_b3;
  TAngle<double> local_b0;
  Vector2 local_a8;
  TVector3<double> local_98;
  DVector3 local_80;
  AActor *local_68;
  AActor *piece;
  PClassActor *cls;
  int j;
  int i;
  MetaClass *p3;
  MetaClass *p2;
  MetaClass *p1;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x1d,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x1d,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  p1 = (MetaClass *)(param->field_0).field_1.a;
  local_b3 = true;
  if (p1 != (MetaClass *)0x0) {
    local_b3 = DObject::IsKindOf((DObject *)p1,AActor::RegistrationInfo.MyClass);
  }
  if (local_b3 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x1d,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x1e,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
     (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
    bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
  }
  if (bVar3) {
    p2 = (MetaClass *)pVStack_18[(int)self].field_0.field_1.a;
    local_b6 = true;
    if (p2 != (MetaClass *)0x0) {
      local_b6 = PClass::IsDescendantOf((PClass *)p2,AActor::RegistrationInfo.MyClass);
    }
    if (local_b6 == false) {
      __assert_fail("p1 == NULL || p1->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                    ,0x1e,
                    "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (ret_local._4_4_ <= (int)self) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                    ,0x1f,
                    "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    bVar3 = false;
    if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
      bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
    }
    if (bVar3) {
      p3 = (MetaClass *)pVStack_18[(int)self].field_0.field_1.a;
      local_b9 = true;
      if (p3 != (MetaClass *)0x0) {
        local_b9 = PClass::IsDescendantOf((PClass *)p3,AActor::RegistrationInfo.MyClass);
      }
      if (local_b9 == false) {
        __assert_fail("p2 == NULL || p2->IsDescendantOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x1f,
                      "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      self._0_4_ = (int)self + 1;
      if (ret_local._4_4_ <= (int)self) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x20,
                      "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      bVar3 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (bVar3) {
        _j = (AActor *)pVStack_18[(int)self].field_0.field_1.a;
        local_bc = true;
        if (_j != (AActor *)0x0) {
          local_bc = PClass::IsDescendantOf((PClass *)_j,AActor::RegistrationInfo.MyClass);
        }
        if (local_bc != false) {
          cls._0_4_ = 0;
          for (cls._4_4_ = 0; cls._4_4_ < 3; cls._4_4_ = cls._4_4_ + 1) {
            if ((int)cls == 0) {
              local_c8 = (AActor *)p2;
            }
            else {
              if ((int)cls == 1) {
                local_d0 = (AActor *)p3;
              }
              else {
                local_d0 = _j;
              }
              local_c8 = local_d0;
            }
            piece = local_c8;
            if (local_c8 != (AActor *)0x0) {
              AActor::Pos(&local_80,(AActor *)p1);
              local_68 = Spawn((PClassActor *)local_c8,&local_80,ALLOW_REPLACE);
              if (local_68 != (AActor *)0x0) {
                pPVar1 = &p1->super_PClass;
                TAngle<double>::TAngle(&local_b0,(double)cls._4_4_ * 120.0);
                TAngle<double>::ToVector((TAngle<double> *)&local_a8,1.0);
                operator+(&local_98,(TVector3<double> *)&(pPVar1->SpecialInits).Most,&local_a8);
                TVector3<double>::operator=(&local_68->Vel,&local_98);
                TFlags<ActorFlag,_unsigned_int>::operator|=(&local_68->flags,MF_DROPPED);
                if ((int)cls == 0) {
                  uVar2 = FRandom::operator()(&pr_quietusdrop);
                  local_e4 = (uVar2 & 1) + 1;
                }
                else {
                  local_e4 = 3 - (int)cls;
                }
                cls._0_4_ = local_e4;
              }
            }
          }
          return 0;
        }
        __assert_fail("p3 == NULL || p3->IsDescendantOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x20,
                      "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                    ,0x20,
                    "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x1f,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x1e,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_DropWeaponPieces)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(p1, AActor);
	PARAM_CLASS(p2, AActor);
	PARAM_CLASS(p3, AActor);

	for (int i = 0, j = 0; i < 3; ++i)
	{
		PClassActor *cls = j == 0 ?  p1 : j == 1 ? p2 : p3;
		if (cls)
		{
			AActor *piece = Spawn (cls, self->Pos(), ALLOW_REPLACE);
			if (piece != NULL)
			{
				piece->Vel = self->Vel + DAngle(i*120.).ToVector(1);
				piece->flags |= MF_DROPPED;
				j = (j == 0) ? (pr_quietusdrop() & 1) + 1 : 3-j;
			}
		}
	}
	return 0;
}